

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_backend.h
# Opt level: O3

void __thiscall basisu::basisu_backend_output::clear(basisu_backend_output *this)

{
  uchar *puVar1;
  basisu_backend_slice_desc *__ptr;
  void *__ptr_00;
  unsigned_short *__ptr_01;
  ulong uVar2;
  long lVar3;
  vector<unsigned_char> *__ptr_02;
  
  this->m_tex_format = cETC1S;
  this->m_etc1s = false;
  this->m_uses_global_codebooks = false;
  this->m_srgb = true;
  this->m_num_endpoints = 0;
  this->m_num_selectors = 0;
  puVar1 = (this->m_endpoint_palette).m_p;
  if (puVar1 != (uchar *)0x0) {
    free(puVar1);
    (this->m_endpoint_palette).m_p = (uchar *)0x0;
    (this->m_endpoint_palette).m_size = 0;
    (this->m_endpoint_palette).m_capacity = 0;
  }
  puVar1 = (this->m_selector_palette).m_p;
  if (puVar1 != (uchar *)0x0) {
    free(puVar1);
    (this->m_selector_palette).m_p = (uchar *)0x0;
    (this->m_selector_palette).m_size = 0;
    (this->m_selector_palette).m_capacity = 0;
  }
  __ptr = (this->m_slice_desc).m_p;
  if (__ptr != (basisu_backend_slice_desc *)0x0) {
    free(__ptr);
    (this->m_slice_desc).m_p = (basisu_backend_slice_desc *)0x0;
    (this->m_slice_desc).m_size = 0;
    (this->m_slice_desc).m_capacity = 0;
  }
  puVar1 = (this->m_slice_image_tables).m_p;
  if (puVar1 != (uchar *)0x0) {
    free(puVar1);
    (this->m_slice_image_tables).m_p = (uchar *)0x0;
    (this->m_slice_image_tables).m_size = 0;
    (this->m_slice_image_tables).m_capacity = 0;
  }
  __ptr_02 = (this->m_slice_image_data).m_p;
  if (__ptr_02 != (vector<unsigned_char> *)0x0) {
    uVar2 = (ulong)(this->m_slice_image_data).m_size;
    if (uVar2 != 0) {
      lVar3 = 0;
      do {
        __ptr_00 = *(void **)((long)&__ptr_02->m_p + lVar3);
        if (__ptr_00 != (void *)0x0) {
          free(__ptr_00);
        }
        lVar3 = lVar3 + 0x10;
      } while (uVar2 << 4 != lVar3);
      __ptr_02 = (this->m_slice_image_data).m_p;
    }
    free(__ptr_02);
    (this->m_slice_image_data).m_p = (vector<unsigned_char> *)0x0;
    (this->m_slice_image_data).m_size = 0;
    (this->m_slice_image_data).m_capacity = 0;
  }
  __ptr_01 = (this->m_slice_image_crcs).m_p;
  if (__ptr_01 != (unsigned_short *)0x0) {
    free(__ptr_01);
    (this->m_slice_image_crcs).m_p = (unsigned_short *)0x0;
    (this->m_slice_image_crcs).m_size = 0;
    (this->m_slice_image_crcs).m_capacity = 0;
  }
  return;
}

Assistant:

void clear()
		{
			m_tex_format = basist::basis_tex_format::cETC1S;
			m_etc1s = false;
			m_uses_global_codebooks = false;
			m_srgb = true;

			m_num_endpoints = 0;
			m_num_selectors = 0;

			m_endpoint_palette.clear();
			m_selector_palette.clear();
			m_slice_desc.clear();
			m_slice_image_tables.clear();
			m_slice_image_data.clear();
			m_slice_image_crcs.clear();
		}